

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void icu_63::number::impl::PatternParser::patternInfoToProperties
               (DecimalFormatProperties *properties,ParsedPatternInfo *patternInfo,
               IgnoreRounding _ignoreRounding,UErrorCode *status)

{
  int iVar1;
  uint64_t uVar2;
  short sVar3;
  bool bVar4;
  char16_t cVar5;
  int32_t iVar6;
  int32_t iVar7;
  ParsedSubpatternInfo *pPVar8;
  double dVar9;
  UnicodeString local_1d0;
  UnicodeString local_190;
  UnicodeString local_150;
  undefined1 local_110 [8];
  UnicodeString rawPaddingString;
  int paddingWidth;
  undefined1 local_c0 [8];
  UnicodeString posSuffix;
  UnicodeString posPrefix;
  int minFrac;
  int minInt;
  int16_t grouping3;
  int16_t grouping2;
  int16_t grouping1;
  bool ignoreRounding;
  ParsedSubpatternInfo *positive;
  UErrorCode *status_local;
  IgnoreRounding _ignoreRounding_local;
  ParsedPatternInfo *patternInfo_local;
  DecimalFormatProperties *properties_local;
  
  pPVar8 = &patternInfo->positive;
  if (_ignoreRounding == IGNORE_ROUNDING_NEVER) {
    minInt._3_1_ = 0;
  }
  else if (_ignoreRounding == IGNORE_ROUNDING_IF_CURRENCY) {
    minInt._3_1_ = (patternInfo->positive).hasCurrencySign & 1;
  }
  else {
    minInt._3_1_ = 1;
  }
  sVar3 = (short)(pPVar8->groupingSizes >> 0x10);
  uVar2 = pPVar8->groupingSizes;
  if (sVar3 == -1) {
    properties->groupingSize = -1;
    properties->groupingUsed = false;
  }
  else {
    properties->groupingSize = (int)(short)pPVar8->groupingSizes;
    properties->groupingUsed = true;
  }
  if ((short)(uVar2 >> 0x20) == -1) {
    properties->secondaryGroupingSize = -1;
  }
  else {
    properties->secondaryGroupingSize = (int)sVar3;
  }
  if (((patternInfo->positive).integerTotal == 0) && (0 < (patternInfo->positive).fractionTotal)) {
    posPrefix.fUnion._52_4_ = 0;
    posPrefix.fUnion._48_4_ = uprv_max_63(1,(patternInfo->positive).fractionNumerals);
  }
  else if (((patternInfo->positive).integerNumerals == 0) &&
          ((patternInfo->positive).fractionNumerals == 0)) {
    posPrefix.fUnion._52_4_ = 1;
    posPrefix.fUnion._48_4_ = 0;
  }
  else {
    posPrefix.fUnion._52_4_ = (patternInfo->positive).integerNumerals;
    posPrefix.fUnion._48_4_ = (patternInfo->positive).fractionNumerals;
  }
  if ((patternInfo->positive).integerAtSigns < 1) {
    bVar4 = DecimalQuantity::isZero(&(patternInfo->positive).rounding);
    if (bVar4) {
      if (minInt._3_1_ == 0) {
        properties->minimumFractionDigits = posPrefix.fUnion._48_4_;
        properties->maximumFractionDigits = (patternInfo->positive).fractionTotal;
        properties->roundingIncrement = 0.0;
      }
      else {
        properties->minimumFractionDigits = -1;
        properties->maximumFractionDigits = -1;
        properties->roundingIncrement = 0.0;
      }
      properties->minimumSignificantDigits = -1;
      properties->maximumSignificantDigits = -1;
    }
    else {
      if (minInt._3_1_ == 0) {
        properties->minimumFractionDigits = posPrefix.fUnion._48_4_;
        properties->maximumFractionDigits = (patternInfo->positive).fractionTotal;
        dVar9 = DecimalQuantity::toDouble(&(patternInfo->positive).rounding);
        properties->roundingIncrement = dVar9;
      }
      else {
        properties->minimumFractionDigits = -1;
        properties->maximumFractionDigits = -1;
        properties->roundingIncrement = 0.0;
      }
      properties->minimumSignificantDigits = -1;
      properties->maximumSignificantDigits = -1;
    }
  }
  else {
    properties->minimumFractionDigits = -1;
    properties->maximumFractionDigits = -1;
    properties->roundingIncrement = 0.0;
    properties->minimumSignificantDigits = (patternInfo->positive).integerAtSigns;
    properties->maximumSignificantDigits =
         (patternInfo->positive).integerAtSigns + (patternInfo->positive).integerTrailingHashSigns;
  }
  if ((((patternInfo->positive).hasDecimal & 1U) == 0) ||
     ((patternInfo->positive).fractionTotal != 0)) {
    properties->decimalSeparatorAlwaysShown = false;
  }
  else {
    properties->decimalSeparatorAlwaysShown = true;
  }
  if ((patternInfo->positive).exponentZeros < 1) {
    properties->exponentSignAlwaysShown = false;
    properties->minimumExponentDigits = -1;
    properties->minimumIntegerDigits = posPrefix.fUnion._52_4_;
    properties->maximumIntegerDigits = -1;
  }
  else {
    properties->exponentSignAlwaysShown = (bool)((patternInfo->positive).exponentHasPlusSign & 1);
    properties->minimumExponentDigits = (patternInfo->positive).exponentZeros;
    if ((patternInfo->positive).integerAtSigns == 0) {
      properties->minimumIntegerDigits = (patternInfo->positive).integerNumerals;
      properties->maximumIntegerDigits = (patternInfo->positive).integerTotal;
    }
    else {
      properties->minimumIntegerDigits = 1;
      properties->maximumIntegerDigits = -1;
    }
  }
  (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
            ((undefined1 *)((long)&posSuffix.fUnion + 0x30),patternInfo,0x100);
  (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])(local_c0,patternInfo,0)
  ;
  if (((patternInfo->positive).hasPadding & 1U) == 0) {
    properties->formatWidth = -1;
    UnicodeString::setToBogus(&properties->padString);
    NullableValue<UNumberFormatPadPosition>::nullify(&properties->padPosition);
  }
  else {
    iVar1 = (patternInfo->positive).widthExceptAffixes;
    iVar6 = AffixUtils::estimateLength((UnicodeString *)((long)&posSuffix.fUnion + 0x30),status);
    iVar7 = AffixUtils::estimateLength((UnicodeString *)local_c0,status);
    rawPaddingString.fUnion._48_4_ = iVar1 + iVar6 + iVar7;
    properties->formatWidth = rawPaddingString.fUnion._48_4_;
    (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
              (local_110,patternInfo,0x400);
    iVar6 = UnicodeString::length((UnicodeString *)local_110);
    if (iVar6 == 1) {
      UnicodeString::operator=(&properties->padString,(UnicodeString *)local_110);
    }
    else {
      iVar6 = UnicodeString::length((UnicodeString *)local_110);
      if (iVar6 == 2) {
        cVar5 = UnicodeString::charAt((UnicodeString *)local_110,0);
        if (cVar5 == L'\'') {
          UnicodeString::setTo(&properties->padString,L"\'",-1);
        }
        else {
          UnicodeString::operator=(&properties->padString,(UnicodeString *)local_110);
        }
      }
      else {
        iVar6 = UnicodeString::length((UnicodeString *)local_110);
        UnicodeString::UnicodeString(&local_150,(UnicodeString *)local_110,1,iVar6 + -2);
        UnicodeString::operator=(&properties->padString,&local_150);
        UnicodeString::~UnicodeString(&local_150);
      }
    }
    NullableValue<UNumberFormatPadPosition>::operator=
              (&properties->padPosition,&(patternInfo->positive).paddingLocation);
    UnicodeString::~UnicodeString((UnicodeString *)local_110);
  }
  UnicodeString::operator=
            (&properties->positivePrefixPattern,(UnicodeString *)((long)&posSuffix.fUnion + 0x30));
  UnicodeString::operator=(&properties->positiveSuffixPattern,(UnicodeString *)local_c0);
  if ((patternInfo->fHasNegativeSubpattern & 1U) == 0) {
    UnicodeString::setToBogus(&properties->negativePrefixPattern);
    UnicodeString::setToBogus(&properties->negativeSuffixPattern);
  }
  else {
    (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
              (&local_190,patternInfo,0x300);
    UnicodeString::operator=(&properties->negativePrefixPattern,&local_190);
    UnicodeString::~UnicodeString(&local_190);
    (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
              (&local_1d0,patternInfo,0x200);
    UnicodeString::operator=(&properties->negativeSuffixPattern,&local_1d0);
    UnicodeString::~UnicodeString(&local_1d0);
  }
  if (((patternInfo->positive).hasPercentSign & 1U) == 0) {
    if (((patternInfo->positive).hasPerMilleSign & 1U) == 0) {
      properties->magnitudeMultiplier = 0;
    }
    else {
      properties->magnitudeMultiplier = 3;
    }
  }
  else {
    properties->magnitudeMultiplier = 2;
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_c0);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&posSuffix.fUnion + 0x30));
  return;
}

Assistant:

void
PatternParser::patternInfoToProperties(DecimalFormatProperties& properties, ParsedPatternInfo& patternInfo,
                                       IgnoreRounding _ignoreRounding, UErrorCode& status) {
    // Translate from PatternParseResult to Properties.
    // Note that most data from "negative" is ignored per the specification of DecimalFormat.

    const ParsedSubpatternInfo& positive = patternInfo.positive;

    bool ignoreRounding;
    if (_ignoreRounding == IGNORE_ROUNDING_NEVER) {
        ignoreRounding = false;
    } else if (_ignoreRounding == IGNORE_ROUNDING_IF_CURRENCY) {
        ignoreRounding = positive.hasCurrencySign;
    } else {
        U_ASSERT(_ignoreRounding == IGNORE_ROUNDING_ALWAYS);
        ignoreRounding = true;
    }

    // Grouping settings
    auto grouping1 = static_cast<int16_t> (positive.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((positive.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((positive.groupingSizes >> 32) & 0xffff);
    if (grouping2 != -1) {
        properties.groupingSize = grouping1;
        properties.groupingUsed = true;
    } else {
        properties.groupingSize = -1;
        properties.groupingUsed = false;
    }
    if (grouping3 != -1) {
        properties.secondaryGroupingSize = grouping2;
    } else {
        properties.secondaryGroupingSize = -1;
    }

    // For backwards compatibility, require that the pattern emit at least one min digit.
    int minInt, minFrac;
    if (positive.integerTotal == 0 && positive.fractionTotal > 0) {
        // patterns like ".##"
        minInt = 0;
        minFrac = uprv_max(1, positive.fractionNumerals);
    } else if (positive.integerNumerals == 0 && positive.fractionNumerals == 0) {
        // patterns like "#.##"
        minInt = 1;
        minFrac = 0;
    } else {
        minInt = positive.integerNumerals;
        minFrac = positive.fractionNumerals;
    }

    // Rounding settings
    // Don't set basic rounding when there is a currency sign; defer to CurrencyUsage
    if (positive.integerAtSigns > 0) {
        properties.minimumFractionDigits = -1;
        properties.maximumFractionDigits = -1;
        properties.roundingIncrement = 0.0;
        properties.minimumSignificantDigits = positive.integerAtSigns;
        properties.maximumSignificantDigits = positive.integerAtSigns + positive.integerTrailingHashSigns;
    } else if (!positive.rounding.isZero()) {
        if (!ignoreRounding) {
            properties.minimumFractionDigits = minFrac;
            properties.maximumFractionDigits = positive.fractionTotal;
            properties.roundingIncrement = positive.rounding.toDouble();
        } else {
            properties.minimumFractionDigits = -1;
            properties.maximumFractionDigits = -1;
            properties.roundingIncrement = 0.0;
        }
        properties.minimumSignificantDigits = -1;
        properties.maximumSignificantDigits = -1;
    } else {
        if (!ignoreRounding) {
            properties.minimumFractionDigits = minFrac;
            properties.maximumFractionDigits = positive.fractionTotal;
            properties.roundingIncrement = 0.0;
        } else {
            properties.minimumFractionDigits = -1;
            properties.maximumFractionDigits = -1;
            properties.roundingIncrement = 0.0;
        }
        properties.minimumSignificantDigits = -1;
        properties.maximumSignificantDigits = -1;
    }

    // If the pattern ends with a '.' then force the decimal point.
    if (positive.hasDecimal && positive.fractionTotal == 0) {
        properties.decimalSeparatorAlwaysShown = true;
    } else {
        properties.decimalSeparatorAlwaysShown = false;
    }

    // Scientific notation settings
    if (positive.exponentZeros > 0) {
        properties.exponentSignAlwaysShown = positive.exponentHasPlusSign;
        properties.minimumExponentDigits = positive.exponentZeros;
        if (positive.integerAtSigns == 0) {
            // patterns without '@' can define max integer digits, used for engineering notation
            properties.minimumIntegerDigits = positive.integerNumerals;
            properties.maximumIntegerDigits = positive.integerTotal;
        } else {
            // patterns with '@' cannot define max integer digits
            properties.minimumIntegerDigits = 1;
            properties.maximumIntegerDigits = -1;
        }
    } else {
        properties.exponentSignAlwaysShown = false;
        properties.minimumExponentDigits = -1;
        properties.minimumIntegerDigits = minInt;
        properties.maximumIntegerDigits = -1;
    }

    // Compute the affix patterns (required for both padding and affixes)
    UnicodeString posPrefix = patternInfo.getString(AffixPatternProvider::AFFIX_PREFIX);
    UnicodeString posSuffix = patternInfo.getString(0);

    // Padding settings
    if (positive.hasPadding) {
        // The width of the positive prefix and suffix templates are included in the padding
        int paddingWidth = positive.widthExceptAffixes +
                           AffixUtils::estimateLength(posPrefix, status) +
                           AffixUtils::estimateLength(posSuffix, status);
        properties.formatWidth = paddingWidth;
        UnicodeString rawPaddingString = patternInfo.getString(AffixPatternProvider::AFFIX_PADDING);
        if (rawPaddingString.length() == 1) {
            properties.padString = rawPaddingString;
        } else if (rawPaddingString.length() == 2) {
            if (rawPaddingString.charAt(0) == u'\'') {
                properties.padString.setTo(u"'", -1);
            } else {
                properties.padString = rawPaddingString;
            }
        } else {
            properties.padString = UnicodeString(rawPaddingString, 1, rawPaddingString.length() - 2);
        }
        properties.padPosition = positive.paddingLocation;
    } else {
        properties.formatWidth = -1;
        properties.padString.setToBogus();
        properties.padPosition.nullify();
    }

    // Set the affixes
    // Always call the setter, even if the prefixes are empty, especially in the case of the
    // negative prefix pattern, to prevent default values from overriding the pattern.
    properties.positivePrefixPattern = posPrefix;
    properties.positiveSuffixPattern = posSuffix;
    if (patternInfo.fHasNegativeSubpattern) {
        properties.negativePrefixPattern = patternInfo.getString(
                AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN | AffixPatternProvider::AFFIX_PREFIX);
        properties.negativeSuffixPattern = patternInfo.getString(
                AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN);
    } else {
        properties.negativePrefixPattern.setToBogus();
        properties.negativeSuffixPattern.setToBogus();
    }

    // Set the magnitude multiplier
    if (positive.hasPercentSign) {
        properties.magnitudeMultiplier = 2;
    } else if (positive.hasPerMilleSign) {
        properties.magnitudeMultiplier = 3;
    } else {
        properties.magnitudeMultiplier = 0;
    }
}